

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem_utils.cpp
# Opt level: O3

bool FileSysUtilsCombinePaths(string *parent,string *child,string *combined)

{
  int iVar1;
  long *plVar2;
  long *plVar3;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  long *local_60;
  ulong local_58;
  long local_50 [2];
  long *local_40;
  long local_38;
  long local_30;
  long lStack_28;
  
  if (((parent->_M_string_length == 0) ||
      (iVar1 = std::__cxx11::string::compare((char *)parent), iVar1 == 0)) ||
     (iVar1 = std::__cxx11::string::compare((char *)parent), iVar1 == 0)) {
    std::__cxx11::string::_M_assign((string *)combined);
  }
  else {
    std::__cxx11::string::substr((ulong)&local_60,(ulong)parent);
    plVar2 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_60,local_58,0,'\x01');
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_70 = *plVar3;
      lStack_68 = plVar2[3];
      local_80 = &local_70;
    }
    else {
      local_70 = *plVar3;
      local_80 = (long *)*plVar2;
    }
    local_78 = plVar2[1];
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_80,(ulong)(child->_M_dataplus)._M_p);
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_30 = *plVar3;
      lStack_28 = plVar2[3];
      local_40 = &local_30;
    }
    else {
      local_30 = *plVar3;
      local_40 = (long *)*plVar2;
    }
    local_38 = plVar2[1];
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::string::operator=((string *)combined,(string *)&local_40);
    if (local_40 != &local_30) {
      operator_delete(local_40,local_30 + 1);
    }
    if (local_80 != &local_70) {
      operator_delete(local_80,local_70 + 1);
    }
    if (local_60 != local_50) {
      operator_delete(local_60,local_50[0] + 1);
    }
  }
  return true;
}

Assistant:

bool FileSysUtilsCombinePaths(const std::string& parent, const std::string& child, std::string& combined) {
    std::string::size_type parent_len = parent.length();
    if (0 == parent_len || "." == parent || "./" == parent) {
        combined = child;
        return true;
    }
    char last_char = parent[parent_len - 1];
    if (last_char == DIRECTORY_SYMBOL) {
        parent_len--;
    }
    combined = parent.substr(0, parent_len) + DIRECTORY_SYMBOL + child;
    return true;
}